

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Probe(int source,int tag,MPIABI_Comm comm,MPIABI_Status *status)

{
  undefined8 uVar1;
  int iVar2;
  MPI_Status *mpi_status_ptr;
  
  iVar2 = MPI_Probe();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (status->mpi_status).status_OpenMPI.f0;
    uVar1 = *(undefined8 *)((long)&status->mpi_status + 4);
    status->MPI_TAG = (int)uVar1;
    status->MPI_ERROR = (int)((ulong)uVar1 >> 0x20);
  }
  return iVar2;
}

Assistant:

int MPIABI_Probe(
  int source,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Status * status
) {
  return MPI_Probe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}